

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleResizeEvent(QWidgetWindow *this,QResizeEvent *event)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegion dirtyRegion;
  QRect oldRect;
  QWidgetPrivate *in_stack_ffffffffffffffa8;
  WidgetAttribute attribute;
  QWidgetPrivate *this_00;
  QRegion in_stack_ffffffffffffffc8;
  QRect local_30;
  QRegion local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b593b);
  local_18 = (undefined1  [16])QWidget::rect((QWidget *)in_stack_ffffffffffffffc8.d);
  bVar1 = updateSize((QWidgetWindow *)in_stack_ffffffffffffffc8.d);
  if (bVar1) {
    pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b596e);
    QCoreApplication::forwardEvent(&pQVar2->super_QObject,(QEvent *)in_RSI,(QEvent *)0x0);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b598d);
    QWidget::d_func((QWidget *)0x3b5995);
    bVar1 = QWidgetPrivate::shouldPaintOnScreen(in_stack_ffffffffffffffa8);
    if (bVar1) {
      local_20.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b59c0);
      attribute = (WidgetAttribute)((ulong)in_RDI >> 0x20);
      local_30 = QWidget::rect((QWidget *)in_stack_ffffffffffffffc8.d);
      QRegion::QRegion(&local_20,(QRect *)&local_30,Rectangle);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b59f1);
      bVar1 = QWidget::testAttribute(in_RSI,attribute);
      if (bVar1) {
        QRegion::QRegion((QRegion *)&stack0xffffffffffffffc8,(QRect *)local_18,Rectangle);
        QRegion::operator-=(&local_20,(QRegion *)&stack0xffffffffffffffc8);
        QRegion::~QRegion((QRegion *)&stack0xffffffffffffffc8);
      }
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b5a3c);
      QWidget::d_func((QWidget *)0x3b5a44);
      QWidgetPrivate::syncBackingStore(this_00,(QRegion *)in_RSI);
      QRegion::~QRegion(&local_20);
    }
    else {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b5a6b);
      QWidget::d_func((QWidget *)0x3b5a73);
      QWidgetPrivate::syncBackingStore(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleResizeEvent(QResizeEvent *event)
{
    auto oldRect = m_widget->rect();

    if (updateSize()) {
        QGuiApplication::forwardEvent(m_widget, event);

        if (m_widget->d_func()->shouldPaintOnScreen()) {
            QRegion dirtyRegion = m_widget->rect();
            if (m_widget->testAttribute(Qt::WA_StaticContents))
                dirtyRegion -= oldRect;
            m_widget->d_func()->syncBackingStore(dirtyRegion);
        } else {
            m_widget->d_func()->syncBackingStore();
        }
    }
}